

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O2

Gia_Man_t * Gia_ManFromAigSwitch(Aig_Man_t *p)

{
  int iVar1;
  Gia_Man_t *p_00;
  char *pcVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  int iVar5;
  Vec_Ptr_t *p_01;
  
  p_00 = Gia_ManStart(p->vObjs->nSize - p->nDeleted);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  p_00->nConstrs = p->nConstrs;
  Aig_ManCleanData(p);
  (p->pConst1->field_5).iData = 1;
  for (iVar5 = 0; iVar5 < p->vCis->nSize; iVar5 = iVar5 + 1) {
    pvVar3 = Vec_PtrEntry(p->vCis,iVar5);
    iVar1 = Gia_ManAppendCi(p_00);
    *(int *)((long)pvVar3 + 0x28) = iVar1;
  }
  for (iVar5 = 0; iVar5 < p->vObjs->nSize; iVar5 = iVar5 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar5);
    if (((pAVar4 != (Aig_Obj_t *)0x0) && (*(uint *)&pAVar4->field_0x18 < 0x40)) &&
       ((*(uint *)&pAVar4->field_0x18 & 7) - 5 < 2)) {
      Gia_ManFromAig_rec(p_00,p,pAVar4);
      Gia_ManAppendCo(p_00,(pAVar4->field_5).iData);
    }
  }
  iVar5 = 0;
  while( true ) {
    p_01 = p->vCos;
    iVar1 = p_01->nSize;
    if (iVar1 <= iVar5) break;
    pvVar3 = Vec_PtrEntry(p_01,iVar5);
    Gia_ManFromAig_rec(p_00,p,(Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe));
    iVar5 = iVar5 + 1;
  }
  for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_01,iVar5);
    iVar1 = Gia_ObjChild0Copy(pAVar4);
    iVar1 = Gia_ManAppendCo(p_00,iVar1);
    (pAVar4->field_5).iData = iVar1;
    p_01 = p->vCos;
    iVar1 = p_01->nSize;
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManFromAigSwitch( Aig_Man_t * p )
{
    Gia_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // create the new manager
    pNew = Gia_ManStart( Aig_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->iData = 1;
    Aig_ManForEachCi( p, pObj, i )
        pObj->iData = Gia_ManAppendCi( pNew );
    // add POs corresponding to the nodes with choices
    Aig_ManForEachNode( p, pObj, i )
        if ( Aig_ObjRefs(pObj) == 0 )
        {
            Gia_ManFromAig_rec( pNew, p, pObj );        
            Gia_ManAppendCo( pNew, pObj->iData );
        }
    // add logic for the POs
    Aig_ManForEachCo( p, pObj, i )
        Gia_ManFromAig_rec( pNew, p, Aig_ObjFanin0(pObj) );        
    Aig_ManForEachCo( p, pObj, i )
        pObj->iData = Gia_ManAppendCo( pNew, Gia_ObjChild0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    return pNew;
}